

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

Promise<int> __thiscall
kj::Timer::timeoutAfter<int>(Timer *this,Duration delay,Promise<int> *promise)

{
  SourceLocation location;
  Promise<int> *in_RCX;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  char *local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  (**(code **)(*delay.value + 0x10))((anon_class_1_0_00000001_for_func *)&local_38);
  Promise<void>::
  then<kj::Timer::timeoutAfter<int>(kj::Quantity<long,kj::_::NanosecondLabel>,kj::Promise<int>&&)::_lambda()_1_>
            ((Promise<void> *)&local_40,(anon_class_1_0_00000001_for_func *)&local_38);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.h";
  pcStack_28 = "timeoutAfter";
  local_20 = 0xa0000009b;
  location.function = "timeoutAfter";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.h";
  location.lineNumber = 0x9b;
  location.columnNumber = 10;
  Promise<int>::exclusiveJoin((Promise<int> *)this,in_RCX,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Timer::timeoutAfter(Duration delay, Promise<T>&& promise) {
  return promise.exclusiveJoin(afterDelay(delay).then([]() -> kj::Promise<T> {
    return makeTimeoutException();
  }));
}